

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O2

el_action_t em_kill_region(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  wchar_t num;
  
  pwVar1 = (el->el_chared).c_kill.mark;
  if (pwVar1 != (wchar_t *)0x0) {
    pwVar3 = (el->el_line).cursor;
    pwVar2 = (el->el_chared).c_kill.buf;
    num = L'\0';
    if (pwVar3 < pwVar1) {
      for (; pwVar3 < pwVar1; pwVar3 = pwVar3 + 1) {
        *pwVar2 = *pwVar3;
        pwVar2 = pwVar2 + 1;
        num = num + L'\x01';
      }
      (el->el_chared).c_kill.last = pwVar2;
      c_delafter(el,num);
    }
    else {
      for (; pwVar1 < pwVar3; pwVar1 = pwVar1 + 1) {
        *pwVar2 = *pwVar1;
        pwVar2 = pwVar2 + 1;
        num = num + L'\x01';
      }
      (el->el_chared).c_kill.last = pwVar2;
      c_delbefore(el,num);
      (el->el_line).cursor = (el->el_chared).c_kill.mark;
    }
    return '\x04';
  }
  return '\x06';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_kill_region(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *kp, *cp;

	if (!el->el_chared.c_kill.mark)
		return CC_ERROR;

	if (el->el_chared.c_kill.mark > el->el_line.cursor) {
		cp = el->el_line.cursor;
		kp = el->el_chared.c_kill.buf;
		while (cp < el->el_chared.c_kill.mark)
			*kp++ = *cp++;	/* copy it */
		el->el_chared.c_kill.last = kp;
		c_delafter(el, (int)(cp - el->el_line.cursor));
	} else {		/* mark is before cursor */
		cp = el->el_chared.c_kill.mark;
		kp = el->el_chared.c_kill.buf;
		while (cp < el->el_line.cursor)
			*kp++ = *cp++;	/* copy it */
		el->el_chared.c_kill.last = kp;
		c_delbefore(el, (int)(cp - el->el_chared.c_kill.mark));
		el->el_line.cursor = el->el_chared.c_kill.mark;
	}
	return CC_REFRESH;
}